

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-pipe.c
# Opt level: O0

int lws_plat_pipe_create(lws *wsi)

{
  lws_context *plVar1;
  int iVar2;
  int iVar3;
  lws_context_per_thread *pt;
  lws *wsi_local;
  
  plVar1 = wsi->context;
  iVar3 = (int)wsi->tsi;
  iVar2 = eventfd(0,0x80800);
  plVar1->pt[iVar3].dummy_pipe_fds[0] = iVar2;
  plVar1->pt[iVar3].dummy_pipe_fds[1] = -1;
  iVar2 = 0;
  if (plVar1->pt[iVar3].dummy_pipe_fds[0] < 0) {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int
lws_plat_pipe_create(struct lws *wsi)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
#if defined(LWS_HAVE_EVENTFD)
	pt->dummy_pipe_fds[0] = eventfd(0, EFD_CLOEXEC|EFD_NONBLOCK);
	pt->dummy_pipe_fds[1] = -1;
	return pt->dummy_pipe_fds[0]<0?-1:0;
#elif defined(LWS_HAVE_PIPE2)
	return pipe2(pt->dummy_pipe_fds, O_NONBLOCK);
#else
	return pipe(pt->dummy_pipe_fds);
#endif
}